

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O3

node_t make_node(size_t refcount_,size_t prefix_length_,size_t edgecount_)

{
  uchar *data_;
  node_t node;
  node_t local_30;
  
  data_ = (uchar *)malloc(prefix_length_ + edgecount_ * 9 + 0xc);
  if (data_ == (uchar *)0x0) {
    make_node();
  }
  node_t::node_t(&local_30,data_);
  *(int *)local_30._data = (int)refcount_;
  *(int *)(local_30._data + 4) = (int)prefix_length_;
  *(int *)(local_30._data + 8) = (int)edgecount_;
  return (node_t)local_30._data;
}

Assistant:

node_t make_node (size_t refcount_, size_t prefix_length_, size_t edgecount_)
{
    const size_t node_size = 3 * sizeof (uint32_t) + prefix_length_
                             + edgecount_ * (1 + sizeof (void *));

    unsigned char *data = static_cast<unsigned char *> (malloc (node_size));
    zmq_assert (data);

    node_t node (data);
    node.set_refcount (static_cast<uint32_t> (refcount_));
    node.set_prefix_length (static_cast<uint32_t> (prefix_length_));
    node.set_edgecount (static_cast<uint32_t> (edgecount_));
    return node;
}